

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestTwoStep::Run(BuildTestTwoStep *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *pNVar3;
  size_type sVar4;
  reference pvVar5;
  bool local_15c;
  bool local_15a;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  undefined4 local_68;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string err;
  BuildTestTwoStep *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"cat12",&local_51);
  pNVar3 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_50,(string *)local_30);
  testing::Test::Check
            (pTVar1,pNVar3 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x304,"builder_.AddTarget(\"cat12\", &err)");
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x305,"\"\" == err");
  pTVar1 = g_current_test;
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
    local_68 = 1;
    goto LAB_00136db6;
  }
  bVar2 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x306,"builder_.Build(&err)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x307,"\"\" == err");
  pTVar1 = g_current_test;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
  bVar2 = testing::Test::Check
                    (pTVar1,sVar4 == 3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x308,"3u == command_runner_.commands_ran_.size()");
  pTVar1 = g_current_test;
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
    local_68 = 1;
    goto LAB_00136db6;
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,0);
  bVar2 = std::operator==(pvVar5,"cat in1 > cat1");
  if (bVar2) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,1);
    bVar2 = std::operator==(pvVar5,"cat in1 in2 > cat2");
    local_15a = true;
    if (!bVar2) goto LAB_0013679c;
  }
  else {
LAB_0013679c:
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,1);
    bVar2 = std::operator==(pvVar5,"cat in1 > cat1");
    local_15c = false;
    if (bVar2) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,0);
      local_15c = std::operator==(pvVar5,"cat in1 in2 > cat2");
    }
    local_15a = local_15c;
  }
  testing::Test::Check
            (pTVar1,local_15a,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x30e,
             "(command_runner_.commands_ran_[0] == \"cat in1 > cat1\" && command_runner_.commands_ran_[1] == \"cat in1 in2 > cat2\") || (command_runner_.commands_ran_[1] == \"cat in1 > cat1\" && command_runner_.commands_ran_[0] == \"cat in1 in2 > cat2\")"
            );
  pTVar1 = g_current_test;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,2);
  bVar2 = std::operator==("cat cat1 cat2 > cat12",pvVar5);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x310,"\"cat cat1 cat2 > cat12\" == command_runner_.commands_ran_[2]");
  VirtualFileSystem::Tick(&(this->super_BuildTest).fs_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"in2",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
  VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  State::Reset(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"cat12",&local_d9);
  pNVar3 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_d8,(string *)local_30);
  testing::Test::Check
            (pTVar1,pNVar3 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x318,"builder_.AddTarget(\"cat12\", &err)");
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x319,"\"\" == err");
  pTVar1 = g_current_test;
  if (bVar2) {
    bVar2 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_30);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x31a,"builder_.Build(&err)");
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x31b,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar2) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar4 == 5,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x31c,"5u == command_runner_.commands_ran_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,3);
        bVar2 = std::operator==("cat in1 in2 > cat2",pvVar5);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x31d,"\"cat in1 in2 > cat2\" == command_runner_.commands_ran_[3]");
        pTVar1 = g_current_test;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,4);
        bVar2 = std::operator==("cat cat1 cat2 > cat12",pvVar5);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x31e,"\"cat cat1 cat2 > cat12\" == command_runner_.commands_ran_[4]");
        local_68 = 0;
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_68 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_68 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_68 = 1;
  }
LAB_00136db6:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(BuildTest, TwoStep) {
  string err;
  EXPECT_TRUE(builder_.AddTarget("cat12", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
  // Depending on how the pointers work out, we could've ran
  // the first two commands in either order.
  EXPECT_TRUE((command_runner_.commands_ran_[0] == "cat in1 > cat1" &&
               command_runner_.commands_ran_[1] == "cat in1 in2 > cat2") ||
              (command_runner_.commands_ran_[1] == "cat in1 > cat1" &&
               command_runner_.commands_ran_[0] == "cat in1 in2 > cat2"));

  EXPECT_EQ("cat cat1 cat2 > cat12", command_runner_.commands_ran_[2]);

  fs_.Tick();

  // Modifying in2 requires rebuilding one intermediate file
  // and the final file.
  fs_.Create("in2", "");
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("cat12", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(5u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cat in1 in2 > cat2", command_runner_.commands_ran_[3]);
  EXPECT_EQ("cat cat1 cat2 > cat12", command_runner_.commands_ran_[4]);
}